

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLAssetLoader15.cpp
# Opt level: O3

void __thiscall COLLADASaxFWL::AssetLoader15::data__up_axis(AssetLoader15 *this)

{
  long *plVar1;
  int in_ESI;
  
  if (3 < in_ESI - 1U) {
    in_ESI = 0;
  }
  plVar1 = *(long **)&(this->super_IParserImpl15).super_IParserImpl.mCOLLADAVersion;
  (**(code **)(*plVar1 + 0x1b0))(plVar1,in_ESI);
  return;
}

Assistant:

bool AssetLoader15::data__up_axis( const COLLADASaxFWL15::ENUM__up_axis_enum value )
{
SaxVirtualFunctionTest15(data__up_axis(value));
COLLADASaxFWL::ENUM__UpAxisType val;
switch (value) {
case COLLADASaxFWL15::ENUM__up_axis_enum__X_UP: val=COLLADASaxFWL::ENUM__UpAxisType__X_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__Y_UP: val=COLLADASaxFWL::ENUM__UpAxisType__Y_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__Z_UP: val=COLLADASaxFWL::ENUM__UpAxisType__Z_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__COUNT: val=COLLADASaxFWL::ENUM__UpAxisType__INVALID; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__NOT_PRESENT: val=COLLADASaxFWL::ENUM__UpAxisType__NOT_PRESENT; break;
}
return mLoader->data__up_axis(val);
}